

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArray::BigIndex::SetItemIfNotExist(BigIndex *this,JavascriptArray *arr,Var newValue)

{
  uint uVar1;
  ScriptContext *scriptContext;
  int iVar2;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  Var oldValue;
  
  if (this->index != 0xffffffff) {
    IndexTrace<unsigned_int>::SetItemIfNotExist(arr,&this->index,newValue);
    return;
  }
  scriptContext =
       (((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  JavascriptOperators::GetPropertyIdForInt(this->bigIndex,scriptContext,&local_38);
  uVar1 = local_38->pid;
  iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x12])
                    (arr,arr,(ulong)uVar1,&propertyRecord,0,scriptContext);
  if (iVar2 != 1) {
    (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
              (arr,(ulong)uVar1,newValue,0,0);
  }
  return;
}

Assistant:

void JavascriptArray::BigIndex::SetItemIfNotExist(JavascriptArray* arr, Var newValue) const
    {
        if (IsSmallIndex())
        {
            small_index::SetItemIfNotExist(arr, index, newValue);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            Var oldValue;
            PropertyId propertyId = propertyRecord->GetPropertyId();
            if (!arr->GetProperty(arr, propertyId, &oldValue, NULL, scriptContext))
            {
                arr->SetProperty(propertyId, newValue, PropertyOperation_None, NULL);
            }
        }
    }